

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

slab * slab_get_with_order(slab_cache *cache,uint8_t order)

{
  size_t *psVar1;
  small_stats *psVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  uint8_t uVar6;
  byte order_00;
  long lVar7;
  slab *psVar8;
  rlist *prVar9;
  slab *psVar10;
  rlist *prVar11;
  rlist **pprVar12;
  rlist *shift;
  rlist *prVar13;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  if (cache->order_max < order) {
    __assert_fail("order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0xe0,"struct slab *slab_get_with_order(struct slab_cache *, uint8_t)");
  }
  uVar5 = (ulong)cache->order_max;
  pprVar12 = &cache->orders[order].slabs.next;
  lVar7 = uVar5 * 0x20 + (ulong)order * -0x20;
  while( true ) {
    prVar9 = (rlist *)(pprVar12 + -1);
    prVar13 = *pprVar12;
    if ((prVar9 != prVar13) || (prVar13 != ((rlist *)(pprVar12 + -1))->prev)) goto LAB_00104ddd;
    if (lVar7 == 0) break;
    pprVar12 = pprVar12 + 4;
    lVar7 = lVar7 + -0x20;
  }
  psVar8 = (slab *)slab_map(cache->arena);
  if (psVar8 == (slab *)0x0) {
    return (slab *)0x0;
  }
  pprVar12 = &cache->orders[uVar5].slabs.next;
  uVar6 = cache->order_max;
  uVar3 = cache->arena->slab_size;
  psVar8->magic = 0xeec0ffee;
  psVar8->order = uVar6;
  psVar8->in_use = '\0';
  psVar8->size = (ulong)uVar3;
  slab_poison(psVar8);
  (psVar8->next_in_cache).prev = &(cache->allocated).slabs;
  (psVar8->next_in_cache).next = (cache->allocated).slabs.next;
  (cache->allocated).slabs.next = (rlist *)psVar8;
  ((psVar8->next_in_cache).next)->prev = (rlist *)psVar8;
  sVar4 = psVar8->size;
  psVar1 = &(cache->allocated).stats.total;
  *psVar1 = *psVar1 + sVar4;
  prVar13 = &psVar8->next_in_list;
  (psVar8->next_in_list).prev = &cache->orders[uVar5].slabs;
  (psVar8->next_in_list).next = cache->orders[uVar5].slabs.next;
  cache->orders[uVar5].slabs.next = prVar13;
  ((psVar8->next_in_list).next)->prev = prVar13;
  psVar1 = &cache->orders[uVar5].stats.total;
  *psVar1 = *psVar1 + sVar4;
  prVar9 = &cache->orders[uVar5].slabs;
LAB_00104ddd:
  prVar11 = prVar13->next;
  *pprVar12 = prVar11;
  prVar11->prev = prVar9;
  prVar13->prev = prVar13;
  prVar13->next = prVar13;
  psVar8 = (slab *)(prVar13 + -1);
  uVar6 = *(uint8_t *)((long)&prVar13[1].next + 4);
  prVar11 = prVar13[1].prev;
  if (uVar6 != order) {
    prVar9[1].next = (rlist *)((long)prVar9[1].next - (long)prVar11);
    do {
      if (uVar6 == '\0') {
        __assert_fail("slab->order > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                      ,0x8d,"struct slab *slab_split(struct slab_cache *, struct slab *)");
      }
      order_00 = uVar6 - 1;
      prVar9 = (rlist *)slab_order_size(cache,order_00);
      *(undefined4 *)&prVar13[1].next = 0xeec0ffee;
      *(byte *)((long)&prVar13[1].next + 4) = order_00;
      *(undefined1 *)((long)&prVar13[1].next + 5) = 0;
      prVar13[1].prev = prVar9;
      psVar10 = slab_buddy(cache,psVar8);
      psVar10->magic = 0xeec0ffee;
      psVar10->order = order_00;
      psVar10->in_use = '\0';
      psVar10->size = (size_t)prVar9;
      (psVar10->next_in_list).prev = &cache->orders[order_00].slabs;
      (psVar10->next_in_list).next = cache->orders[order_00].slabs.next;
      cache->orders[order_00].slabs.next = &psVar10->next_in_list;
      ((psVar10->next_in_list).next)->prev = &psVar10->next_in_list;
      psVar1 = &cache->orders[order_00].stats.total;
      *psVar1 = (long)&prVar9->prev + *psVar1;
      uVar6 = *(uint8_t *)((long)&prVar13[1].next + 4);
    } while (uVar6 != order);
    prVar11 = prVar13[1].prev;
    psVar1 = &cache->orders[order].stats.total;
    *psVar1 = (long)&prVar11->prev + *psVar1;
  }
  psVar2 = &(cache->allocated).stats;
  psVar2->used = (long)&prVar11->prev + psVar2->used;
  psVar2 = &cache->orders[order].stats;
  psVar2->used = (long)&prVar11->prev + psVar2->used;
  *(uint8_t *)((long)&prVar13[1].next + 5) = order + '\x01';
  slab_assert(cache,psVar8);
  return psVar8;
}

Assistant:

struct slab *
slab_get_with_order(struct slab_cache *cache, uint8_t order)
{
	assert(order <= cache->order_max);
	struct slab *slab;
	/* Search for the first available slab. If a slab
	 * of a bigger size is found, it can be split.
	 * If cache->order_max is reached and there are no
	 * free slabs, allocate a new one on arena.
	 */
	struct slab_list *list= &cache->orders[order];

	for ( ; rlist_empty(&list->slabs); list++) {
		if (list == cache->orders + cache->order_max) {
			slab = slab_map(cache->arena);
			if (slab == NULL)
				return NULL;
			slab_create(slab, cache->order_max,
				    cache->arena->slab_size);
			slab_poison(slab);
			slab_list_add(&cache->allocated, slab,
				      next_in_cache);
			slab_list_add(list, slab, next_in_list);
			break;
		}
	}
	slab = rlist_shift_entry(&list->slabs, struct slab, next_in_list);
	if (slab->order != order) {
		/*
		 * Do not "bill" the size of this slab to this
		 * order, to prevent double accounting of the
		 * same memory.
		 */
		list->stats.total -= slab->size;
		/* Get a slab of the right order. */
		do {
			slab = slab_split(cache, slab);
		} while (slab->order != order);
		/*
		 * Count the slab in this order. The buddy is
		 * already taken care of by slab_split.
		 */
		cache->orders[slab->order].stats.total += slab->size;
	}
	slab_set_used(cache, slab);
	slab_assert(cache, slab);
	return slab;
}